

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O0

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,int *last,
               long *param_3,long *param_4)

{
  anon_class_40_5_aef1ef96 __f;
  initializer_list<int> iVar1;
  pair<long_*,_long> pVar2;
  long local_f8;
  long local_e8;
  long local_d8;
  long local_c8;
  int local_c0 [4];
  iterator local_b0;
  undefined8 local_a8;
  anon_class_40_5_aef1ef96 local_a0;
  long **local_78;
  long lStack_70;
  long local_68;
  uint *puStack_60;
  bool *local_58;
  int *local_50;
  int *local_48;
  bool local_39;
  uint local_38;
  undefined4 uStack_34;
  bool is_sorted;
  uint previous;
  int radix_value_range;
  long *maximums_local;
  long (*counters_local) [256];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_18;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> map_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  uStack_34 = 0x100;
  _previous = param_4;
  maximums_local = param_3;
  _Stack_18._M_current = last;
  local_38 = std::numeric_limits<unsigned_int>::min();
  local_39 = true;
  local_50 = _Stack_18._M_current;
  local_78 = &maximums_local;
  lStack_70 = (long)&counters_local + 6;
  local_68 = (long)&counters_local + 5;
  puStack_60 = &local_38;
  local_58 = &local_39;
  __f.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)lStack_70;
  __f.counters = (long (**) [256])local_78;
  __f.radix = (low_byte_fn *)local_68;
  __f.previous = puStack_60;
  __f.is_sorted = local_58;
  local_48 = first._M_current;
  std::
  for_each<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::detail::collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>)::_lambda(auto:1_const&)_1_>
            (&local_a0,first,_Stack_18,__f);
  pVar2 = partial_sum_max<long*,long*>(maximums_local,maximums_local + 0x100,maximums_local);
  local_c8 = pVar2.second;
  *_previous = local_c8;
  local_c0[0] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x100,maximums_local + 0x200,maximums_local + 0x100);
  local_d8 = pVar2.second;
  _previous[1] = local_d8;
  local_c0[1] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x200,maximums_local + 0x300,maximums_local + 0x200);
  local_e8 = pVar2.second;
  _previous[2] = local_e8;
  local_c0[2] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x300,maximums_local + 0x400,maximums_local + 0x300);
  local_f8 = pVar2.second;
  _previous[3] = local_f8;
  local_c0[3] = 0;
  local_b0 = local_c0;
  local_a8 = 4;
  iVar1._M_len = 4;
  iVar1._M_array = local_b0;
  dummy(iVar1);
  return (bool)(local_39 & 1);
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }